

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::SubjectSetRegisterTest_test_comparator_with_realistic_subjects_Test
::SubjectSetRegisterTest_test_comparator_with_realistic_subjects_Test
          (SubjectSetRegisterTest_test_comparator_with_realistic_subjects_Test *this)

{
  SubjectSetRegisterTest_test_comparator_with_realistic_subjects_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)
       &PTR__SubjectSetRegisterTest_test_comparator_with_realistic_subjects_Test_003dae70;
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, test_comparator_with_realistic_subjects)
{
    std::vector<Subject> shuffle_input(RealSubscriptionExample::REAL_SORTED_LIST);
    auto rng = std::default_random_engine {};

    for (int i = 0; i < 100; i++)
    {
        SubjectSetRegister subject_register = SubjectSetRegister();
        std::shuffle(std::begin(shuffle_input), std::end(shuffle_input), rng);

        for (Subject subject : shuffle_input)
        {
            subject_register.Register(std::move(subject), false);
        }

        EXPECT_EQ(RealSubscriptionExample::REAL_SORTED_LIST, subject_register.NextSubscriptionSync()->GetSubjects());
    }
}